

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# writer.h
# Opt level: O0

ssize_t Fixpp::details::FieldWriter<Fixpp::Field<Fixpp::TagT<269U,_Fixpp::Type::Char>_>_>::write
                  (int __fd,void *__buf,size_t __n)

{
  char cVar1;
  Type *pTVar2;
  ostream *poVar3;
  undefined4 in_register_0000003c;
  Type value;
  Field<Fixpp::TagT<269U,_Fixpp::Type::Char>_> *field_local;
  ostream *os_local;
  
  pTVar2 = Field<Fixpp::TagT<269U,_Fixpp::Type::Char>_>::get
                     ((Field<Fixpp::TagT<269U,_Fixpp::Type::Char>_> *)__buf);
  cVar1 = *pTVar2;
  poVar3 = (ostream *)std::ostream::operator<<((void *)CONCAT44(in_register_0000003c,__fd),0x10d);
  poVar3 = std::operator<<(poVar3,"=");
  poVar3 = std::operator<<(poVar3,cVar1);
  std::operator<<(poVar3,'|');
  return (ssize_t)(void *)CONCAT44(in_register_0000003c,__fd);
}

Assistant:

static std::ostream& write(std::ostream& os, const Field& field)
        {
            auto value = field.get();
            os << Field::Tag::Id << "=" << value << SOH;
            return os;
        }